

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

bool booster::locale::impl_icu::num_base::use_parent<unsigned_short>(ios_base *ios,unsigned_short v)

{
  bool bVar1;
  ios_info *this;
  uint64_t uVar2;
  
  this = ios_info::get(ios);
  uVar2 = ios_info::display_flags(this);
  bVar1 = true;
  if ((uVar2 != 0) && ((uVar2 != 1 || ((*(uint *)(ios + 0x18) & 0x4a) == 2)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool use_parent(std::ios_base &ios,ValueType v)
    {
        uint64_t flg = ios_info::get(ios).display_flags();
        if(flg == flags::posix)
            return true;
        if(details::use_parent_traits<ValueType>::use(v))
            return true;

        if(!std::numeric_limits<ValueType>::is_integer)
            return false;

        if(flg == flags::number && (ios.flags() & std::ios_base::basefield) != std::ios_base::dec) {
            return true;
        }
        return false;
    }